

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O3

void __thiscall binpac::FlowBuffer::MarkOrCopyLine(FlowBuffer *this)

{
  LineBreakStyle LVar1;
  const_byteptr puVar2;
  int iVar3;
  long lVar4;
  anon_enum_32 aVar5;
  long lVar6;
  const_byteptr puVar7;
  const_byteptr puVar8;
  
  LVar1 = this->linebreak_style_;
  if (LVar1 == LINE_BREAKER) {
    puVar7 = this->orig_data_begin_;
    if ((puVar7 != (const_byteptr)0x0) &&
       (puVar2 = this->orig_data_end_, puVar2 != (const_byteptr)0x0)) {
      if (puVar7 < puVar2) {
        lVar6 = 0;
        do {
          if (puVar7[lVar6] == this->linebreaker_) {
            if (this->buffer_n_ == 0) {
              this->frame_length_ = (int)lVar6;
            }
            else {
              AppendToBuffer(this,puVar7,(int)lVar6 + 1);
              this->buffer_n_ = this->buffer_n_ + -1;
            }
            this->message_complete_ = true;
            return;
          }
          lVar4 = lVar6 + 1;
          lVar6 = lVar6 + 1;
        } while (puVar7 + lVar4 != puVar2);
      }
      AppendToBuffer(this,puVar7,(int)puVar2 - (int)puVar7);
      return;
    }
    return;
  }
  if (LVar1 == STRICT_CRLF) {
    puVar7 = this->orig_data_begin_;
    puVar2 = this->orig_data_end_;
    if (puVar7 < puVar2) {
      aVar5 = this->state_;
      iVar3 = -1;
      puVar8 = puVar7;
      do {
        if (*puVar8 == '\r') {
          aVar5 = STRICT_CRLF_1;
LAB_0010296b:
          this->state_ = aVar5;
        }
        else {
          if (*puVar8 != '\n') {
            aVar5 = FRAME_MODE;
            goto LAB_0010296b;
          }
          if (aVar5 == STRICT_CRLF_1) {
            this->state_ = FRAME_MODE;
            if (this->buffer_n_ == 0) {
              this->frame_length_ = iVar3;
            }
            else {
              AppendToBuffer(this,puVar7,iVar3 + 2);
              this->buffer_n_ = this->buffer_n_ + -2;
            }
            this->message_complete_ = true;
            return;
          }
        }
        puVar8 = puVar8 + 1;
        iVar3 = iVar3 + 1;
      } while (puVar8 != puVar2);
    }
    AppendToBuffer(this,puVar7,(int)puVar2 - (int)puVar7);
    return;
  }
  if (LVar1 != CR_OR_LF) {
    return;
  }
  puVar7 = this->orig_data_begin_;
  if ((puVar7 == (const_byteptr)0x0) ||
     (puVar2 = this->orig_data_end_, puVar2 == (const_byteptr)0x0)) {
    return;
  }
  if ((puVar7 < puVar2) && ((this->state_ == CR_OR_LF_1 && (*puVar7 == '\n')))) {
    this->state_ = CR_OR_LF_0;
    puVar7 = puVar7 + 1;
    this->orig_data_begin_ = puVar7;
  }
  lVar6 = (long)puVar2 - (long)puVar7;
  if (puVar7 <= puVar2 && lVar6 != 0) {
    lVar4 = 0;
    do {
      if (puVar7[lVar4] == '\n') {
LAB_0010290b:
        if (this->buffer_n_ == 0) {
          this->frame_length_ = (int)lVar4;
        }
        else {
          AppendToBuffer(this,puVar7,(int)lVar4 + 1);
          this->buffer_n_ = this->buffer_n_ + -1;
        }
        this->message_complete_ = true;
        return;
      }
      if (puVar7[lVar4] == '\r') {
        this->state_ = CR_OR_LF_1;
        goto LAB_0010290b;
      }
      lVar4 = lVar4 + 1;
    } while (lVar6 != lVar4);
  }
  AppendToBuffer(this,puVar7,(int)lVar6);
  return;
}

Assistant:

void FlowBuffer::MarkOrCopyLine()
	{
	switch ( linebreak_style_ )
		{
		case CR_OR_LF:
			MarkOrCopyLine_CR_OR_LF();
			break;
		case STRICT_CRLF:
			MarkOrCopyLine_STRICT_CRLF();
			break;
		case LINE_BREAKER:
			MarkOrCopyLine_LINEBREAK();
			break;
		default:
			BINPAC_ASSERT(0);
			break;
		}
	}